

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_listp_op(sexp ctx,sexp self,sexp_sint_t n,sexp hare)

{
  bool bVar1;
  sexp turtle;
  sexp hare_local;
  sexp_sint_t n_local;
  sexp self_local;
  sexp ctx_local;
  sexp local_8;
  
  if ((((ulong)hare & 3) == 0) && (hare->tag == 6)) {
    hare_local = (hare->value).type.cpl;
    turtle = hare;
    while( true ) {
      bVar1 = false;
      if (((ulong)hare_local & 3) == 0) {
        bVar1 = hare_local->tag == 6;
      }
      if (!bVar1) {
        if (hare_local != (sexp)&DAT_0000023e) {
          return (sexp)&DAT_0000003e;
        }
        return (sexp)&DAT_0000013e;
      }
      if (hare_local == turtle) break;
      hare_local = (hare_local->value).type.cpl;
      if ((((ulong)hare_local & 3) == 0) && (hare_local->tag == 6)) {
        hare_local = (hare_local->value).type.cpl;
      }
      turtle = (turtle->value).type.cpl;
    }
    local_8 = (sexp)&DAT_0000003e;
  }
  else {
    local_8 = (sexp)&DAT_0000003e;
    if (hare == (sexp)&DAT_0000023e) {
      local_8 = (sexp)&DAT_0000013e;
    }
  }
  return local_8;
}

Assistant:

sexp sexp_listp_op (sexp ctx, sexp self, sexp_sint_t n, sexp hare) {
  sexp turtle;
  if (! sexp_pairp(hare))
    return sexp_make_boolean(sexp_nullp(hare));
  turtle = hare;
  hare = sexp_cdr(hare);
  for ( ; sexp_pairp(hare); turtle=sexp_cdr(turtle)) {
    if (hare == turtle) return SEXP_FALSE;
    hare = sexp_cdr(hare);
    if (sexp_pairp(hare)) hare = sexp_cdr(hare);
  }
  return sexp_make_boolean(sexp_nullp(hare));
}